

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkIf(Abc_Ntk_t *pNtk,If_Par_t *pPars)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  void *pvVar6;
  Mio_Library_t *pLib;
  ulong uVar7;
  If_Man_t *pIfMan;
  If_DsdMan_t *pIVar8;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar9;
  Vec_Int_t *p;
  ProgressBar *p_00;
  If_Obj_t *pIVar10;
  Abc_Obj_t *pAVar11;
  If_Par_t *pIVar12;
  char *pcVar13;
  Abc_Ntk_t *pAVar14;
  ulong uVar15;
  Abc_NtkFunc_t Func;
  float fVar16;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                  ,0x70,"Abc_Ntk_t *Abc_NtkIf(Abc_Ntk_t *, If_Par_t *)");
  }
  pfVar5 = Abc_NtkGetCiArrivalFloats(pNtk);
  pPars->pTimesArr = pfVar5;
  pfVar5 = Abc_NtkGetCoRequiredFloats(pNtk);
  pPars->pTimesReq = pfVar5;
  if (((((pPars->fDelayOpt != 0) || (pPars->fDsdBalance != 0)) || (pPars->fUserRecLib != 0)) ||
      (pPars->fUserSesLib != 0)) && (pNtk->pManTime != (Abc_ManTime_t *)0x0)) {
    if ((pNtk->AndGateDelay == 0.0) && (!NAN(pNtk->AndGateDelay))) {
      pvVar6 = Abc_FrameReadLibGen();
      if (pvVar6 == (void *)0x0) {
        fVar16 = pNtk->AndGateDelay;
      }
      else {
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        fVar16 = Mio_LibraryReadDelayAigNode(pLib);
        pNtk->AndGateDelay = fVar16;
      }
      if ((fVar16 == 0.0) && (!NAN(fVar16))) {
        pNtk->AndGateDelay = 1.0;
        puts("The AIG-node delay is not set. Assuming unit-delay.");
      }
    }
    uVar2 = pNtk->vCis->nSize;
    uVar15 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = uVar15;
    }
    for (; uVar7 != uVar15; uVar15 = uVar15 + 1) {
      pPars->pTimesArr[uVar15] = pPars->pTimesArr[uVar15] / pNtk->AndGateDelay;
    }
    uVar2 = pNtk->vCos->nSize;
    uVar15 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = uVar15;
    }
    for (; uVar7 != uVar15; uVar15 = uVar15 + 1) {
      pPars->pTimesReq[uVar15] = pPars->pTimesReq[uVar15] / pNtk->AndGateDelay;
    }
  }
  if ((pPars->fLatchPaths != 0) && (pfVar5 = pPars->pTimesArr, pfVar5 != (float *)0x0)) {
    uVar2 = pNtk->vPis->nSize;
    uVar15 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = uVar15;
    }
    for (; uVar7 != uVar15; uVar15 = uVar15 + 1) {
      pfVar5[uVar15] = -1e+09;
    }
  }
  pIfMan = Abc_NtkToIf(pNtk,pPars);
  if (pIfMan == (If_Man_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  if (pPars->fPower != 0) {
    If_ManComputeSwitching(pIfMan);
  }
  if (pPars->fUseDsd == 0) goto LAB_00292cb8;
  pIVar8 = (If_DsdMan_t *)Abc_FrameReadManDsd();
  iVar4 = pPars->nLutSize;
  iVar3 = If_DsdManVarNum(pIVar8);
  if (iVar3 < iVar4) {
    __assert_fail("pPars->nLutSize <= If_DsdManVarNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                  ,0x9d,"Abc_Ntk_t *Abc_NtkIf(Abc_Ntk_t *, If_Par_t *)");
  }
  pcVar13 = pPars->pLutStruct;
  if (pcVar13 == (char *)0x0) {
    iVar4 = If_DsdManLutSize(pIVar8);
    if (iVar4 != 0) {
      pcVar13 = pPars->pLutStruct;
      if (pcVar13 == (char *)0x0) goto LAB_00292fb7;
      goto LAB_00292c7d;
    }
  }
  else {
LAB_00292c7d:
    cVar1 = *pcVar13;
    iVar4 = If_DsdManLutSize(pIVar8);
    if (cVar1 + -0x30 != iVar4) {
LAB_00292fb7:
      __assert_fail("(pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - \'0\' == If_DsdManLutSize(p))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                    ,0x9e,"Abc_Ntk_t *Abc_NtkIf(Abc_Ntk_t *, If_Par_t *)");
    }
  }
  pIVar8 = (If_DsdMan_t *)Abc_FrameReadManDsd();
  pIfMan->pIfDsdMan = pIVar8;
  if (pPars->fDsdBalance != 0) {
    If_DsdManAllocIsops(pIVar8,pPars->nLutSize);
  }
LAB_00292cb8:
  iVar4 = If_ManPerformMapping(pIfMan);
  if (iVar4 == 0) {
    If_ManStop(pIfMan);
  }
  else {
    pIVar12 = pIfMan->pPars;
    Func = ABC_FUNC_BDD;
    if ((((pIVar12->fUseBdds == 0) && (pIVar12->fUseCnfs == 0)) && (pIVar12->fUseMv == 0)) &&
       ((Func = ABC_FUNC_SOP, pIVar12->fUseSops == 0 && (pIVar12->fUserSesLib == 0)))) {
      Func = (uint)(pIVar12->nGateSize < 1) * 2 + ABC_FUNC_SOP;
    }
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,Func);
    If_ManCleanNodeCopy(pIfMan);
    If_ManCleanCutData(pIfMan);
    pIVar10 = pIfMan->pConst1;
    pAVar9 = Abc_NtkCreateNodeConst1(pNtk_00);
    (pIVar10->field_22).pCopy = pAVar9;
    for (iVar4 = 0; iVar4 < pNtk->vCis->nSize; iVar4 = iVar4 + 1) {
      pAVar9 = Abc_NtkCi(pNtk,iVar4);
      pvVar6 = Vec_PtrEntry(pIfMan->vCis,iVar4);
      *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)((long)pvVar6 + 0x40) = pAVar9->field_6;
    }
    p = Vec_IntAlloc(0x10000);
    p_00 = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
    for (iVar4 = 0; iVar4 < pNtk->vCos->nSize; iVar4 = iVar4 + 1) {
      pAVar9 = Abc_NtkCo(pNtk,iVar4);
      Extra_ProgressBarUpdate(p_00,iVar4,"Final");
      pIVar10 = If_ManCo(pIfMan,iVar4);
      pAVar11 = Abc_NodeFromIf_rec(pNtk_00,pIfMan,pIVar10->pFanin0,p);
      pIVar10 = If_ManCo(pIfMan,iVar4);
      Abc_ObjAddFanin((pAVar9->field_6).pCopy,
                      (Abc_Obj_t *)((ulong)(*(uint *)pIVar10 >> 4 & 1) ^ (ulong)pAVar11));
    }
    Extra_ProgressBarStop(p_00);
    Vec_IntFree(p);
    pAVar9 = (Abc_Obj_t *)(pIfMan->pConst1->field_22).pCopy;
    if (((pAVar9->vFanouts).nSize == 0) && ((pAVar9->field_0x14 & 0xf) != 0)) {
      Abc_NtkDeleteObj(pAVar9);
    }
    pIVar12 = pIfMan->pPars;
    if (((pIVar12->fUseBdds != 0) || (pIVar12->fUseCnfs != 0)) || (pIVar12->fUseMv != 0)) {
      Abc_NtkSweep(pNtk_00,0);
      pIVar12 = pIfMan->pPars;
      if (pIVar12->fUseBdds != 0) {
        Abc_NtkBddReorder(pNtk_00,0);
        pIVar12 = pIfMan->pPars;
      }
    }
    iVar4 = Abc_NtkLogicMakeSimpleCos(pNtk_00,(uint)(pIVar12->fUseBuffs == 0));
    if (((iVar4 != 0) && (pIfMan->pPars->fVerbose != 0)) &&
       (pcVar13 = Abc_FrameReadFlag("silentmode"), pcVar13 == (char *)0x0)) {
      pcVar13 = "Added %d buffers/inverters to decouple the CO drivers.\n";
      if (pIfMan->pPars->fUseBuffs == 0) {
        pcVar13 = "Duplicated %d gates to decouple the CO drivers.\n";
      }
      printf(pcVar13);
    }
    if (pNtk_00 != (Abc_Ntk_t *)0x0) {
      If_ManStop(pIfMan);
      if (((pPars->fDelayOpt == 0) && (pPars->fDsdBalance == 0)) && (pPars->fUserRecLib == 0)) {
        if ((pPars->fBidec != 0) && (pPars->nLutSize < 9)) {
          Abc_NtkBidecResyn(pNtk_00,0);
        }
      }
      else {
        pAVar14 = Abc_NtkStrash(pNtk_00,0,0,0);
        Abc_NtkDelete(pNtk_00);
        pNtk_00 = pAVar14;
      }
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar14 = Abc_NtkDup(pNtk->pExdc);
        pNtk_00->pExdc = pAVar14;
      }
      iVar4 = Abc_NtkCheck(pNtk_00);
      if (iVar4 != 0) {
        return pNtk_00;
      }
      puts("Abc_NtkIf: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars )
{
    Abc_Ntk_t * pNtkNew, * pTemp;
    If_Man_t * pIfMan;

    assert( Abc_NtkIsStrash(pNtk) );

    // get timing information
    pPars->pTimesArr = Abc_NtkGetCiArrivalFloats(pNtk);
    pPars->pTimesReq = Abc_NtkGetCoRequiredFloats(pNtk);

    // update timing info to reflect logic level
    if ( (pPars->fDelayOpt || pPars->fDsdBalance || pPars->fUserRecLib || pPars->fUserSesLib) && pNtk->pManTime )
    {
        int c;
        if ( pNtk->AndGateDelay == 0.0 )
        {
            if ( Abc_FrameReadLibGen() )
                pNtk->AndGateDelay = Mio_LibraryReadDelayAigNode((Mio_Library_t *)Abc_FrameReadLibGen());
            if ( pNtk->AndGateDelay == 0.0 )
            {
                pNtk->AndGateDelay = 1.0;
                printf( "The AIG-node delay is not set. Assuming unit-delay.\n" );
            }
        }
        for ( c = 0; c < Abc_NtkCiNum(pNtk); c++ )
            pPars->pTimesArr[c] /= pNtk->AndGateDelay;
        for ( c = 0; c < Abc_NtkCoNum(pNtk); c++ )
            pPars->pTimesReq[c] /= pNtk->AndGateDelay;
    }

    // set the latch paths
    if ( pPars->fLatchPaths && pPars->pTimesArr )
    {
        int c;
        for ( c = 0; c < Abc_NtkPiNum(pNtk); c++ )
            pPars->pTimesArr[c] = -ABC_INFINITY;
    }

    // create FPGA mapper
    pIfMan = Abc_NtkToIf( pNtk, pPars );    
    if ( pIfMan == NULL )
        return NULL;
    if ( pPars->fPower )
        If_ManComputeSwitching( pIfMan );

    // create DSD manager
    if ( pPars->fUseDsd )
    {
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        assert( pPars->nLutSize <= If_DsdManVarNum(p) );
        assert( (pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - '0' == If_DsdManLutSize(p)) );
        pIfMan->pIfDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->fDsdBalance )
            If_DsdManAllocIsops( pIfMan->pIfDsdMan, pPars->nLutSize );
    }

    // perform FPGA mapping
    if ( !If_ManPerformMapping( pIfMan ) )
    {
        If_ManStop( pIfMan );
        return NULL;
    }

    // transform the result of mapping into the new network
    pNtkNew = Abc_NtkFromIf( pIfMan, pNtk );
    if ( pNtkNew == NULL )
        return NULL;
    If_ManStop( pIfMan );
    if ( pPars->fDelayOpt || pPars->fDsdBalance || pPars->fUserRecLib )
    {
        pNtkNew = Abc_NtkStrash( pTemp = pNtkNew, 0, 0, 0 );
        Abc_NtkDelete( pTemp );
    }
    else if ( pPars->fBidec && pPars->nLutSize <= 8 )
        Abc_NtkBidecResyn( pNtkNew, 0 );

    // duplicate EXDC
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkIf: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}